

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

void __thiscall
QInternalMessageLogContext::populateBacktrace(QInternalMessageLogContext *this,int frameCount)

{
  uint uVar1;
  enable_if_t<is_constructible_v<QVarLengthArray<void_*,_32LL>,_int>,_QVarLengthArray<void_*,_32LL>_&>
  this_00;
  ulong aalloc;
  ulong asize;
  long in_FS_OFFSET;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = frameCount + 3;
  this_00 = std::optional<QVarLengthArray<void_*,_32LL>_>::emplace<int>(&this->backtrace,&local_1c);
  uVar1 = backtrace((this_00->super_QVLABase<void_*>).super_QVLABaseBase.ptr,
                    (int)(this_00->super_QVLABase<void_*>).super_QVLABaseBase.s);
  if ((int)uVar1 < 1) {
    asize = 0;
  }
  else {
    asize = (ulong)uVar1;
    aalloc = (this_00->super_QVLABase<void_*>).super_QVLABaseBase.a;
    if ((long)aalloc <= (long)asize) {
      aalloc = asize;
    }
    QVLABase<void_*>::reallocate_impl
              (&this_00->super_QVLABase<void_*>,0x20,&this_00->super_QVLAStorage<8UL,_8UL,_32LL>,
               asize,aalloc);
  }
  (this_00->super_QVLABase<void_*>).super_QVLABaseBase.s = asize;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void QInternalMessageLogContext::populateBacktrace(int frameCount)
{
    assert(frameCount >= 0);
    BacktraceStorage &result = backtrace.emplace(TypicalBacktraceFrameCount + frameCount);
    int n = ::backtrace(result.data(), result.size());
    if (n <= 0)
        result.clear();
    else
        result.resize(n);
}